

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O1

void av1_ml_prune_rect_partition
               (AV1_COMP *cpi,MACROBLOCK *x,int64_t best_rd,int64_t none_rd,int64_t *split_rd,
               PartitionSearchState *part_state)

{
  byte bVar1;
  bool bVar2;
  AV1_COMP *pAVar3;
  buf_2d *pbVar4;
  _Bool _Var5;
  int i;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  BLOCK_SIZE BVar9;
  uint uVar10;
  long lVar11;
  int i_1;
  ulong uVar12;
  BLOCK_SIZE bsize;
  NN_CONFIG *pNVar13;
  ExtPartController *ext_part_controller;
  float mi_col;
  long lVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float features [9];
  int split_variance [4];
  buf_2d buf;
  float probs [3];
  float raw_scores [3];
  int in_stack_ffffffffffffd3f8;
  undefined8 local_2bf0;
  float local_2be8 [8];
  float fStack_2bc8;
  NN_CONFIG *local_2bb8;
  buf_2d *local_2bb0;
  uint local_2ba8 [6];
  buf_2d local_2b90;
  aom_partition_features_t local_2b70;
  aom_partition_decision_t local_2078;
  
  bsize = (BLOCK_SIZE)part_state;
  BVar9 = (part_state->part_blk_params).bsize;
  uVar12 = (ulong)BVar9;
  if (999999999 < best_rd || uVar12 < 3) {
    return;
  }
  lVar7 = 1;
  if (1 < best_rd) {
    lVar7 = best_rd;
  }
  bVar2 = true;
  mi_col = 0.0;
  pNVar13 = (NN_CONFIG *)0x0;
  switch(BVar9) {
  case BLOCK_16X16:
    pNVar13 = &av1_rect_partition_nnconfig_16;
LAB_001ee488:
    mi_col = 0.01;
    break;
  case BLOCK_16X32:
  case BLOCK_32X16:
  case BLOCK_32X64:
  case BLOCK_64X32:
  case BLOCK_64X128:
  case BLOCK_128X64:
    goto switchD_001ee470_caseD_7;
  case BLOCK_32X32:
    pNVar13 = &av1_rect_partition_nnconfig_32;
    mi_col = 0.004;
    break;
  case BLOCK_64X64:
    pNVar13 = &av1_rect_partition_nnconfig_64;
    goto LAB_001ee4a2;
  case BLOCK_128X128:
    pNVar13 = &av1_rect_partition_nnconfig_128;
LAB_001ee4a2:
    mi_col = 0.002;
    break;
  default:
    if (BVar9 == BLOCK_8X8) {
      pNVar13 = &av1_rect_partition_nnconfig_8;
      goto LAB_001ee488;
    }
    goto switchD_001ee470_caseD_7;
  }
  bVar2 = false;
switchD_001ee470_caseD_7:
  if (bVar2) {
    return;
  }
  lVar11 = 1;
  auVar17 = _DAT_004ca290;
  do {
    if (SUB164(auVar17 ^ _DAT_004ca2a0,4) == -0x80000000 &&
        SUB164(auVar17 ^ _DAT_004ca2a0,0) < -0x7ffffffb) {
      *(undefined4 *)((long)&local_2bf0 + lVar11 * 4 + 4) = 0x3f800000;
      local_2be8[lVar11] = 1.0;
    }
    lVar15 = auVar17._8_8_;
    auVar17._0_8_ = auVar17._0_8_ + 2;
    auVar17._8_8_ = lVar15 + 2;
    lVar11 = lVar11 + 2;
  } while (lVar11 != 7);
  if (none_rd - 1U < 999999999) {
    local_2be8[0] = (float)none_rd / (float)lVar7;
  }
  lVar11 = 0;
  do {
    if (split_rd[lVar11] - 1U < 999999999) {
      local_2be8[lVar11 + 1] = (float)split_rd[lVar11] / (float)lVar7;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 4);
  local_2bb0 = &x->plane[0].src;
  bVar2 = false;
  uVar6 = av1_get_perpixel_variance_facade(cpi,&x->e_mbd,local_2bb0,BVar9,0);
  pbVar4 = local_2bb0;
  uVar10 = 1;
  if (1 < (int)uVar6) {
    uVar10 = uVar6;
  }
  switch(uVar12) {
  case 0:
    uVar8 = uVar12;
    goto LAB_001ee641;
  case 1:
  case 2:
  case 4:
  case 5:
  case 7:
  case 8:
switchD_001ee5eb_caseD_1:
    bVar2 = true;
    uVar8 = 6;
    goto LAB_001ee641;
  case 3:
    uVar8 = 1;
    break;
  case 6:
    uVar8 = 2;
    break;
  case 9:
    uVar8 = 3;
    break;
  default:
    if (BVar9 == BLOCK_64X64) {
      uVar8 = 4;
    }
    else {
      if (BVar9 != BLOCK_128X128) goto switchD_001ee5eb_caseD_1;
      uVar8 = 5;
    }
  }
  bVar2 = false;
LAB_001ee641:
  BVar9 = BLOCK_INVALID;
  if (!bVar2) {
    BVar9 = subsize_lookup[3][uVar8];
  }
  local_2b90.stride = x->plane[0].src.stride;
  bVar1 = block_size_wide[uVar12];
  uVar12 = 0;
  local_2bf0 = cpi;
  local_2bb8 = pNVar13;
  do {
    uVar8 = 0;
    if ((uVar12 & 1) != 0) {
      uVar8 = (ulong)(bVar1 >> 1);
    }
    local_2b90.buf =
         pbVar4->buf +
         (ulong)(((uint)(uVar12 >> 1) & 0x7fffffff) * (uint)bVar1 >> 1) * (long)local_2b90.stride +
         uVar8;
    uVar6 = av1_get_perpixel_variance_facade(local_2bf0,&x->e_mbd,&local_2b90,BVar9,0);
    pAVar3 = local_2bf0;
    local_2ba8[uVar12] = uVar6;
    uVar12 = uVar12 + 1;
  } while (uVar12 != 4);
  auVar14._0_4_ = (float)(int)uVar10;
  auVar14._4_4_ = auVar14._0_4_;
  auVar14._8_4_ = auVar14._0_4_;
  auVar14._12_4_ = auVar14._0_4_;
  auVar16._0_4_ = (float)(int)local_2ba8[0];
  auVar16._4_4_ = (float)(int)local_2ba8[1];
  auVar16._8_4_ = (float)(int)local_2ba8[2];
  auVar16._12_4_ = (float)(int)local_2ba8[3];
  auVar17 = divps(auVar16,auVar14);
  local_2be8[5] = auVar17._0_4_;
  local_2be8._24_8_ = auVar17._4_8_;
  fStack_2bc8 = auVar17._12_4_;
  write_features_to_file
            ((local_2bf0->oxcf).partition_info_path,(local_2bf0->ext_part_controller).test_mode != 0
             ,local_2be8,9,5,bsize,in_stack_ffffffffffffd3f8,(int)mi_col);
  if ((((pAVar3->common).current_frame.frame_type & 0xfd) != 0) &&
     (ext_part_controller = &pAVar3->ext_part_controller, ext_part_controller->ready != 0)) {
    local_2b70.id = AOM_EXT_PART_FEATURE_AFTER_SPLIT_PART2;
    local_2b70.after_part_split.f_prune_rect[1] = local_2be8[1];
    local_2b70.after_part_split.f_prune_rect[0] = local_2be8[0];
    local_2b70.after_part_split.f_prune_rect[5] = local_2be8[5];
    local_2b70.after_part_split.f_prune_rect[4] = local_2be8[4];
    local_2b70.after_part_split.f_prune_rect[2] = local_2be8[2];
    local_2b70.after_part_split.f_prune_rect[3] = local_2be8[3];
    local_2b70.after_part_split.f_prune_rect[6] = local_2be8[6];
    local_2b70.after_part_split.f_prune_rect[7] = local_2be8[7];
    local_2b70.after_part_split.f_prune_rect[8] = fStack_2bc8;
    av1_ext_part_send_features(ext_part_controller,&local_2b70);
    _Var5 = av1_ext_part_get_partition_decision(ext_part_controller,&local_2078);
    if (_Var5) {
      *&part_state->prune_rect_part = local_2078.prune_rect_part;
      return;
    }
  }
  local_2078.partition_decision[0] = 0;
  local_2078.is_final_decision = 0;
  local_2078.num_nodes = 0;
  (*av1_nn_predict)(local_2be8,local_2bb8,1,(float *)&local_2078);
  local_2b70.before_part_none.f[1] = 0.0;
  local_2b70.id = AOM_EXT_PART_FEATURE_BEFORE_NONE;
  local_2b70.before_part_none.f[0] = 0.0;
  av1_nn_softmax((float *)&local_2078,(float *)&local_2b70,3);
  if (local_2b70.before_part_none.f[0] <= mi_col) {
    part_state->prune_rect_part[0] = 1;
  }
  if (local_2b70.before_part_none.f[1] <= mi_col) {
    part_state->prune_rect_part[1] = 1;
  }
  return;
}

Assistant:

void av1_ml_prune_rect_partition(AV1_COMP *const cpi, const MACROBLOCK *const x,
                                 int64_t best_rd, int64_t none_rd,
                                 const int64_t *split_rd,
                                 PartitionSearchState *part_state) {
  const PartitionBlkParams *blk_params = &part_state->part_blk_params;
  const int mi_row = blk_params->mi_row, mi_col = blk_params->mi_col;
  const BLOCK_SIZE bsize = blk_params->bsize;

  if (bsize < BLOCK_8X8 || best_rd >= 1000000000) return;
  best_rd = AOMMAX(best_rd, 1);
  const NN_CONFIG *nn_config = NULL;
  const float prob_thresholds[5] = { 0.01f, 0.01f, 0.004f, 0.002f, 0.002f };
  float cur_thresh = 0.0f;
  switch (bsize) {
    case BLOCK_8X8:
      nn_config = &av1_rect_partition_nnconfig_8;
      cur_thresh = prob_thresholds[0];
      break;
    case BLOCK_16X16:
      nn_config = &av1_rect_partition_nnconfig_16;
      cur_thresh = prob_thresholds[1];
      break;
    case BLOCK_32X32:
      nn_config = &av1_rect_partition_nnconfig_32;
      cur_thresh = prob_thresholds[2];
      break;
    case BLOCK_64X64:
      nn_config = &av1_rect_partition_nnconfig_64;
      cur_thresh = prob_thresholds[3];
      break;
    case BLOCK_128X128:
      nn_config = &av1_rect_partition_nnconfig_128;
      cur_thresh = prob_thresholds[4];
      break;
    default: assert(0 && "Unexpected bsize.");
  }
  if (!nn_config) return;

  // 1. Compute input features
  float features[9];

  // RD cost ratios
  for (int i = 0; i < 5; i++) features[i] = 1.0f;
  if (none_rd > 0 && none_rd < 1000000000)
    features[0] = (float)none_rd / (float)best_rd;
  for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
    if (split_rd[i] > 0 && split_rd[i] < 1000000000)
      features[1 + i] = (float)split_rd[i] / (float)best_rd;
  }

  // Variance ratios
  const MACROBLOCKD *const xd = &x->e_mbd;
  int whole_block_variance;
  whole_block_variance = av1_get_perpixel_variance_facade(
      cpi, xd, &x->plane[0].src, bsize, AOM_PLANE_Y);
  whole_block_variance = AOMMAX(whole_block_variance, 1);

  int split_variance[SUB_PARTITIONS_SPLIT];
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_SPLIT);
  struct buf_2d buf;
  buf.stride = x->plane[0].src.stride;
  const int bw = block_size_wide[bsize];
  for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
    const int x_idx = (i & 1) * bw / 2;
    const int y_idx = (i >> 1) * bw / 2;
    buf.buf = x->plane[0].src.buf + x_idx + y_idx * buf.stride;
    split_variance[i] =
        av1_get_perpixel_variance_facade(cpi, xd, &buf, subsize, AOM_PLANE_Y);
  }

  for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++)
    features[5 + i] = (float)split_variance[i] / (float)whole_block_variance;

  // Write features to file
  write_features_to_file(cpi->oxcf.partition_info_path,
                         cpi->ext_part_controller.test_mode, features,
                         /*feature_size=*/9, 5, bsize, mi_row, mi_col);

  if (ext_ml_model_decision_after_split_part2(
          &cpi->ext_part_controller, frame_is_intra_only(&cpi->common),
          features, &part_state->prune_rect_part[HORZ],
          &part_state->prune_rect_part[VERT])) {
    return;
  }

  // 2. Do the prediction and prune 0-2 partitions based on their probabilities
  float raw_scores[3] = { 0.0f };
  av1_nn_predict(features, nn_config, 1, raw_scores);
  float probs[3] = { 0.0f };
  av1_nn_softmax(raw_scores, probs, 3);

  // probs[0] is the probability of the fact that both rectangular partitions
  // are worse than current best_rd
  if (probs[1] <= cur_thresh) part_state->prune_rect_part[HORZ] = 1;
  if (probs[2] <= cur_thresh) part_state->prune_rect_part[VERT] = 1;
}